

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

int __thiscall
AbstractModuleClient::processReplyMsg(AbstractModuleClient *this,string *repType,TrodesMsg *msg)

{
  network_pimpl *pnVar1;
  bool bVar2;
  int iVar3;
  binarydata statedata;
  binarydata configdata;
  TrodesConfig newConfig;
  string local_148;
  binarydata local_128;
  binarydata local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  TrodesConfig local_88;
  TrodesConfig local_50;
  
  iVar3 = std::__cxx11::string::compare((char *)repType);
  if (iVar3 == 0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"4","");
    TrodesMsg::popcontents<unsigned_int>(msg,&local_c8,(uint *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    (*(this->super_MlmWrap)._vptr_MlmWrap[0xe])
              (this,(ulong)(uint)local_88.super_NetworkDataType._vptr_NetworkDataType);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)repType);
    if (iVar3 == 0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"i","");
      TrodesMsg::popcontents<int>(msg,&local_e8,(int *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      (*(this->super_MlmWrap)._vptr_MlmWrap[0xf])
                (this,(ulong)(uint)local_88.super_NetworkDataType._vptr_NetworkDataType);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)repType);
      if (iVar3 == 0) {
        TrodesConfig::TrodesConfig(&local_88);
        binarydata::binarydata(&local_108);
        binarydata::binarydata(&local_128);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"nn","");
        TrodesMsg::popcontents<binarydata,binarydata>(msg,&local_148,&local_108,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        TrodesConfig::decode(&local_88,&local_108);
        bVar2 = TrodesConfig::isValid(&local_88);
        if (bVar2) {
          TrodesConfig::TrodesConfig(&local_50,&local_88);
          MlmWrap::setTrodesConfig(&this->super_MlmWrap,&local_50);
          TrodesConfig::~TrodesConfig(&local_50);
        }
        pnVar1 = (this->super_MlmWrap).state;
        (*(pnVar1->super_NetworkDataType)._vptr_NetworkDataType[3])(pnVar1,&local_128);
        network_pimpl::getTimestamp_endpoint_abi_cxx11_(&local_a8,(this->super_MlmWrap).state);
        subToTimestamps(this,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.str._M_dataplus._M_p != &local_128.str.field_2) {
          operator_delete(local_128.str._M_dataplus._M_p,
                          local_128.str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.str._M_dataplus._M_p != &local_108.str.field_2) {
          operator_delete(local_108.str._M_dataplus._M_p,
                          local_108.str.field_2._M_allocated_capacity + 1);
        }
        TrodesConfig::~TrodesConfig(&local_88);
      }
    }
  }
  return 0;
}

Assistant:

int AbstractModuleClient::processReplyMsg(std::string repType, TrodesMsg &msg) {
    int rc = 0;
    if (repType == INFO_TIME) {
        uint32_t time;
        msg.popcontents("4", time);
        recv_time(time);
    }
    else if (repType == INFO_TIMERATE) {
        int timerate;
        msg.popcontents("i", timerate);
        recv_timerate(timerate);
    }
    else if (repType == INFO_CONFIG) {
        TrodesConfig newConfig;
        binarydata configdata;
        binarydata statedata;
        msg.popcontents("nn", configdata, statedata);
        newConfig.decode(configdata);
        if(newConfig.isValid())
            setTrodesConfig(newConfig);

        state->decode(statedata);
        subToTimestamps(state->getTimestamp_endpoint());
    }
    // else {
    //     std::cout << "[AMC]: Reply type [" << repType << "] not recognized.\n";
    // }
    return rc;
}